

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O2

FT_Error bdf_get_bdf_property(BDF_Face face,char *prop_name,BDF_PropertyRec *aproperty)

{
  int iVar1;
  bdf_property_t *pbVar2;
  
  pbVar2 = bdf_get_font_property(face->bdffont,prop_name);
  if (pbVar2 == (bdf_property_t *)0x0) {
    return 6;
  }
  iVar1 = pbVar2->format;
  if (iVar1 == 3) {
    aproperty->type = BDF_PROPERTY_TYPE_CARDINAL;
  }
  else {
    if (iVar1 != 2) {
      if (iVar1 == 1) {
        aproperty->type = BDF_PROPERTY_TYPE_ATOM;
        aproperty->u = *(anon_union_8_3_4cd875ef_for_u *)&pbVar2->value;
        return 0;
      }
      return 6;
    }
    aproperty->type = BDF_PROPERTY_TYPE_INTEGER;
  }
  (aproperty->u).integer = *(FT_Int32 *)&pbVar2->value;
  return 0;
}

Assistant:

static FT_Error
  bdf_get_bdf_property( BDF_Face          face,
                        const char*       prop_name,
                        BDF_PropertyRec  *aproperty )
  {
    bdf_property_t*  prop;


    FT_ASSERT( face && face->bdffont );

    prop = bdf_get_font_property( face->bdffont, prop_name );
    if ( prop )
    {
      switch ( prop->format )
      {
      case BDF_ATOM:
        aproperty->type   = BDF_PROPERTY_TYPE_ATOM;
        aproperty->u.atom = prop->value.atom;
        break;

      case BDF_INTEGER:
        if ( prop->value.l > 0x7FFFFFFFL || prop->value.l < ( -1 - 0x7FFFFFFFL ) )
        {
          FT_TRACE1(( "bdf_get_bdf_property:"
                      " too large integer 0x%x is truncated\n" ));
        }
        aproperty->type      = BDF_PROPERTY_TYPE_INTEGER;
        aproperty->u.integer = (FT_Int32)prop->value.l;
        break;

      case BDF_CARDINAL:
        if ( prop->value.ul > 0xFFFFFFFFUL )
        {
          FT_TRACE1(( "bdf_get_bdf_property:"
                      " too large cardinal 0x%x is truncated\n" ));
        }
        aproperty->type       = BDF_PROPERTY_TYPE_CARDINAL;
        aproperty->u.cardinal = (FT_UInt32)prop->value.ul;
        break;

      default:
        goto Fail;
      }
      return 0;
    }

  Fail:
    return FT_THROW( Invalid_Argument );
  }